

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTPSTRDec(char *val,size_t *len,octet *der,size_t count,u32 tag)

{
  byte bVar1;
  size_t count_00;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  size_t l;
  u32 t;
  size_t local_48;
  u32 local_3c;
  size_t *local_38;
  
  sVar2 = derTLDec(&local_3c,&local_48,der,count);
  count_00 = local_48;
  if (sVar2 == 0xffffffffffffffff) {
    sVar4 = 0xffffffffffffffff;
  }
  else {
    der = der + sVar2;
    sVar4 = 0xffffffffffffffff;
    if (local_48 + sVar2 <= count) {
      sVar4 = local_48 + sVar2;
    }
  }
  if (local_3c == tag && sVar4 != 0xffffffffffffffff) {
    local_38 = len;
    if (local_48 != 0) {
      sVar2 = 0;
      do {
        bVar1 = der[sVar2];
        if ((((byte)(bVar1 - 0x3a) < 0xf6) && ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) &&
           (pvVar3 = memchr(" \'()+,-./:=?",(int)(char)bVar1,0xd), pvVar3 == (void *)0x0))
        goto LAB_0010ed7c;
        sVar2 = sVar2 + 1;
      } while (count_00 != sVar2);
    }
    if (val != (char *)0x0) {
      memMove(val,der,count_00);
      val[local_48] = '\0';
    }
    if (local_38 != (size_t *)0x0) {
      *local_38 = local_48;
    }
  }
  else {
LAB_0010ed7c:
    sVar4 = 0xffffffffffffffff;
  }
  return sVar4;
}

Assistant:

size_t derTPSTRDec(char* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	size_t pos;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// проверить символы (см. strIsPrintable())
	for (pos = 0; pos < l; ++pos)
	{
		register char ch = (char)v[pos];
		if ((ch < '0' || ch > '9') &&
			(ch < 'A' || ch > 'Z') &&
			(ch < 'a' || ch > 'z') &&
			strchr(" '()+,-./:=?", ch) == 0)
		{
			ch = 0;
			return SIZE_MAX;
		}
		ch = 0;
	}
	// возвратить строку
	if (val)
	{
		ASSERT(memIsValid(val, l + 1));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l + 1));
		memMove(val, v, l);
		val[l] = 0;
	}
	// возвратить длину строки
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = l;
	}
	return count;
}